

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcFormalTypeList::add_typed_param(CTcFormalTypeList *this,CTcToken *tok)

{
  char *__src;
  size_t __n;
  CTcFormalTypeEle *pCVar1;
  char *__dest;
  CTcFormalTypeList *pCVar2;
  
  pCVar1 = (CTcFormalTypeEle *)CTcPrsMem::alloc(G_prsmem,0x18);
  __src = tok->text_;
  __n = tok->text_len_;
  __dest = (char *)CTcPrsMem::alloc(G_prsmem,__n + 1);
  pCVar1->name_ = __dest;
  memcpy(__dest,__src,__n);
  pCVar1->name_len_ = __n;
  pCVar2 = (CTcFormalTypeList *)this->tail_;
  if ((CTcFormalTypeList *)this->tail_ == (CTcFormalTypeList *)0x0) {
    pCVar2 = this;
  }
  pCVar2->head_ = pCVar1;
  this->tail_ = pCVar1;
  pCVar1->nxt_ = (CTcFormalTypeEle *)0x0;
  return;
}

Assistant:

void CTcFormalTypeList::add_typed_param(const CTcToken *tok)
{
    add(new (G_prsmem) CTcFormalTypeEle(tok->get_text(), tok->get_text_len()));
}